

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selftest-x25519.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int i;
  uint8_t check [32];
  int local_2c;
  undefined1 local_28 [36];
  undefined4 local_4;
  
  local_4 = 0;
  for (local_2c = 0; local_2c < 0x400; local_2c = local_2c + 1) {
    x25519(local_28,(long)local_2c * 0x60 + 0x104070,table + local_2c);
    iVar1 = memcmp(local_28,table[local_2c].result,0x20);
    if (iVar1 != 0) {
      fprintf(_stderr,"dh-selftest: test number %d failed\n",(ulong)(local_2c + 1));
      return 1;
    }
  }
  local_2c = 0;
  while( true ) {
    if (0x3ff < local_2c) {
      return 0;
    }
    DH(local_28,(long)local_2c * 0x60 + 0x104070,table + local_2c);
    iVar1 = memcmp(local_28,table[local_2c].result,0x20);
    if (iVar1 != 0) break;
    local_2c = local_2c + 1;
  }
  fprintf(_stderr,"dh-selftest: (OLD API) test number %d failed\n",(ulong)(local_2c + 1));
  return 1;
}

Assistant:

int
main()
{
	uint8_t check[X25519_KEY_LEN];
	int i;

	/*
	 * run x25519 tests against table
	 */
	for (i = 0; i < table_num; i++) {
		x25519(check, table[i].scalar, table[i].point);
		if (memcmp(check, table[i].result, X25519_KEY_LEN) != 0) {
			fprintf(stderr, "dh-selftest: test number %d failed\n", i+1);
			return 1;
		}
	}


	/*
	 * test old interface
	 */
	for (i = 0; i < table_num; i++) {
		DH(check, table[i].scalar, table[i].point);
		if (memcmp(check, table[i].result, X25519_KEY_LEN) != 0) {
			fprintf(stderr, "dh-selftest: (OLD API) test number %d failed\n", i+1);
			return 1;
		}
	}

	return 0;
}